

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.cpp
# Opt level: O2

void __thiscall Entity::Hit(Entity *this,int points)

{
  int iVar1;
  ostream *poVar2;
  int iVar3;
  
  iVar1 = this->durability - points;
  iVar3 = 10;
  if (10 < iVar1) {
    iVar3 = iVar1;
  }
  this->durability = iVar3;
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)&this->name);
  poVar2 = std::operator<<(poVar2,"Weapon Durability");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->durability);
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void Entity::Hit(int points) {
  durability = std::max(10, durability - points);
  std::cout << name << "Weapon Durability" << durability << std::endl;
}